

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O2

void __thiscall
wallet::COutput::COutput
          (COutput *this,COutPoint *outpoint,CTxOut *txout,int depth,int input_bytes,bool spendable,
          bool solvable,bool safe,int64_t time,bool from_me,optional<CFeeRate> feerate)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  CFeeRate *this_00;
  CAmount CVar6;
  long *plVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = false;
  uVar3 = *(undefined8 *)((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar5 = *(undefined8 *)((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)(this->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       *(undefined8 *)(outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  *(undefined8 *)((this->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar3
  ;
  *(undefined8 *)((this->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       uVar4;
  *(undefined8 *)((this->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar5;
  (this->outpoint).n = outpoint->n;
  CTxOut::CTxOut(&this->txout,txout);
  this->depth = depth;
  this->input_bytes = input_bytes;
  this->spendable = spendable;
  this->solvable = solvable;
  this->safe = safe;
  this->time = time;
  this->from_me = from_me;
  this->long_term_fee = 0;
  this->ancestor_bump_fees = 0;
  if (feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged == true) {
    if (input_bytes < 0) {
      CVar6 = 0;
    }
    else {
      this_00 = std::optional<CFeeRate>::value(&feerate);
      CVar6 = CFeeRate::GetFee(this_00,input_bytes);
    }
    (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_payload._M_value = CVar6;
    (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_engaged = true;
    lVar2 = txout->nValue;
    plVar7 = std::optional<long>::value(&this->fee);
    (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value = lVar2 - *plVar7;
    (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

COutput(const COutPoint& outpoint, const CTxOut& txout, int depth, int input_bytes, bool spendable, bool solvable, bool safe, int64_t time, bool from_me, const std::optional<CFeeRate> feerate = std::nullopt)
        : outpoint{outpoint},
          txout{txout},
          depth{depth},
          input_bytes{input_bytes},
          spendable{spendable},
          solvable{solvable},
          safe{safe},
          time{time},
          from_me{from_me}
    {
        if (feerate) {
            // base fee without considering potential unconfirmed ancestors
            fee = input_bytes < 0 ? 0 : feerate.value().GetFee(input_bytes);
            effective_value = txout.nValue - fee.value();
        }
    }